

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O0

void __thiscall
TPZFrontMatrix<std::complex<double>,_TPZFileEqnStorage<std::complex<double>_>,_TPZFrontNonSym<std::complex<double>_>_>
::SymbolicAddKel(TPZFrontMatrix<std::complex<double>,_TPZFileEqnStorage<std::complex<double>_>,_TPZFrontNonSym<std::complex<double>_>_>
                 *this,TPZVec<long> *destinationindex)

{
  TPZFrontMatrix<std::complex<double>,_TPZFileEqnStorage<std::complex<double>_>,_TPZFrontNonSym<std::complex<double>_>_>
  *in_RSI;
  TPZVec<long> *in_RDI;
  TPZFrontNonSym<std::complex<double>_> *unaff_retaddr;
  int64_t maxeq;
  int64_t mineq;
  long in_stack_ffffffffffffffe0;
  long in_stack_ffffffffffffffe8;
  
  TPZFrontNonSym<std::complex<double>_>::SymbolicAddKel(unaff_retaddr,in_RDI);
  EquationsToDecompose
            ((TPZFrontMatrix<std::complex<double>,_TPZFileEqnStorage<std::complex<double>_>,_TPZFrontNonSym<std::complex<double>_>_>
              *)mineq,(TPZVec<long> *)maxeq,(int64_t *)unaff_retaddr,(int64_t *)in_RDI);
  if (in_stack_ffffffffffffffe8 <= in_stack_ffffffffffffffe0) {
    TPZFrontNonSym<std::complex<double>_>::SymbolicDecomposeEquations
              ((TPZFrontNonSym<std::complex<double>_> *)in_RSI,in_stack_ffffffffffffffe8,
               in_stack_ffffffffffffffe0);
    CheckCompress(in_RSI);
  }
  return;
}

Assistant:

void TPZFrontMatrix<TVar,store, front>::SymbolicAddKel(TPZVec < int64_t > & destinationindex)
{
	fFront.SymbolicAddKel(destinationindex);
	int64_t mineq, maxeq;
	EquationsToDecompose(destinationindex, mineq, maxeq);
	
	if(maxeq >= mineq) {
		fFront.SymbolicDecomposeEquations(mineq,maxeq);
		CheckCompress();
	}
	
}